

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_memio.h
# Opt level: O1

bool __thiscall ASDCP::MXF::RIP::PartitionPair::Unarchive(PartitionPair *this,MemIOReader *Reader)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  if ((ulong)*(uint *)(Reader + 8) < (ulong)*(uint *)(Reader + 0xc) + 4) {
    bVar4 = false;
  }
  else {
    uVar2 = *(uint *)(*(long *)Reader + (ulong)*(uint *)(Reader + 0xc));
    this->BodySID = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    iVar3 = *(int *)(Reader + 0xc);
    uVar2 = iVar3 + 4;
    *(uint *)(Reader + 0xc) = uVar2;
    uVar1 = (ulong)uVar2 + 8;
    bVar4 = uVar1 <= *(uint *)(Reader + 8);
    if (uVar1 <= *(uint *)(Reader + 8)) {
      uVar1 = *(ulong *)(*(long *)Reader + (ulong)uVar2);
      this->ByteOffset =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      *(int *)(Reader + 0xc) = iVar3 + 0xc;
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

inline bool ReadUi32BE(ui32_t* i) {
	assert(i);
	if ( ( m_size + sizeof(ui32_t) ) > m_capacity )
	  return false;

	*i = KM_i32_BE(cp2i<ui32_t>(m_p + m_size));
	m_size += sizeof(ui32_t);
	return true;
      }